

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int Cudd_VectorSupportSize(DdManager *dd,DdNode **F,int n)

{
  int *support_00;
  int local_40;
  int local_3c;
  int count;
  int size;
  int i;
  int *support;
  int n_local;
  DdNode **F_local;
  DdManager *dd_local;
  
  if (dd->size < dd->sizeZ) {
    local_40 = dd->sizeZ;
  }
  else {
    local_40 = dd->size;
  }
  support_00 = (int *)malloc((long)local_40 << 2);
  if (support_00 == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    dd_local._4_4_ = -1;
  }
  else {
    for (count = 0; count < local_40; count = count + 1) {
      support_00[count] = 0;
    }
    for (count = 0; count < n; count = count + 1) {
      ddSupportStep((DdNode *)((ulong)F[count] & 0xfffffffffffffffe),support_00);
    }
    for (count = 0; count < n; count = count + 1) {
      ddClearFlag((DdNode *)((ulong)F[count] & 0xfffffffffffffffe));
    }
    local_3c = 0;
    for (count = 0; count < local_40; count = count + 1) {
      if (support_00[count] == 1) {
        local_3c = local_3c + 1;
      }
    }
    if (support_00 != (int *)0x0) {
      free(support_00);
    }
    dd_local._4_4_ = local_3c;
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_VectorSupportSize(
  DdManager * dd /* manager */,
  DdNode ** F /* array of DDs whose support is sought */,
  int  n /* size of the array */)
{
    int *support;
    int i;
    int size;
    int count;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    support = ABC_ALLOC(int,size);
    if (support == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(CUDD_OUT_OF_MEM);
    }
    for (i = 0; i < size; i++) {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    for (i = 0; i < n; i++) {
        ddSupportStep(Cudd_Regular(F[i]),support);
    }
    for (i = 0; i < n; i++) {
        ddClearFlag(Cudd_Regular(F[i]));
    }

    /* Count vriables in support. */
    count = 0;
    for (i = 0; i < size; i++) {
        if (support[i] == 1) count++;
    }

    ABC_FREE(support);
    return(count);

}